

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema.c
# Opt level: O2

int lys_ext_dup(ly_ctx *ctx,lys_module *mod,lys_ext_instance **orig,uint8_t size,void *parent,
               LYEXT_PAR parent_type,lys_ext_instance ***new,int shallow,unres_schema *unres)

{
  uint8_t size_00;
  lyext_check_position_clb __size;
  undefined8 *puVar1;
  lys_ext_instance *plVar2;
  lys_ext_instance **pplVar3;
  lys_ext_instance **ctx_00;
  int iVar4;
  lys_ext_instance **e;
  lys_ext_instance *plVar5;
  lys_node *snode;
  lyxml_elem *plVar6;
  char *pcVar7;
  ulong uVar8;
  lys_ext_instance **local_40;
  lys_ext_instance **orig_local;
  
  local_40 = orig;
  orig_local = (lys_ext_instance **)ctx;
  if (new == (lys_ext_instance ***)0x0) {
    __assert_fail("new",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/tree_schema.c"
                  ,0x5e7,
                  "int lys_ext_dup(struct ly_ctx *, struct lys_module *, struct lys_ext_instance **, uint8_t, void *, LYEXT_PAR, struct lys_ext_instance ***, int, struct unres_schema *)"
                 );
  }
  if (size == '\0') {
    if (orig != (lys_ext_instance **)0x0) {
      ly_log(ctx,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
             "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/tree_schema.c"
             ,0x5eb);
      return 1;
    }
    *new = (lys_ext_instance **)0x0;
  }
  else {
    e = (lys_ext_instance **)calloc((ulong)size,8);
    *new = e;
    if (e == (lys_ext_instance **)0x0) {
      ly_log((ly_ctx *)orig_local,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lys_ext_dup")
      ;
      return 1;
    }
    for (uVar8 = 0; pplVar3 = local_40, size != uVar8; uVar8 = uVar8 + 1) {
      plVar5 = local_40[uVar8];
      if (plVar5 == (lys_ext_instance *)0x0) {
        iVar4 = unres_schema_find(unres,-1,&local_40,UNRES_EXT);
        if (iVar4 == -1) {
          ly_log((ly_ctx *)orig_local,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/tree_schema.c"
                 ,0x624);
          goto LAB_00158cb9;
        }
        puVar1 = (undefined8 *)unres->str_snode[iVar4];
        snode = (lys_node *)malloc(0x30);
        if (snode == (lys_node *)0x0) goto LAB_00158c75;
        iVar4 = *(int *)(puVar1 + 1);
        *(int *)&snode->dsc = iVar4;
        if (iVar4 == 2) {
          plVar6 = lyxml_dup_elem((ly_ctx *)orig_local,(lyxml_elem *)*puVar1,(lyxml_elem *)0x0,1,0);
          snode->name = &plVar6->flags;
        }
        snode->ref = (char *)parent;
        *(lys_module **)&snode->flags = mod;
        *(LYEXT_PAR *)&snode->ext = parent_type;
        *(char *)((long)&snode->iffeature + 1) = (char)uVar8;
        iVar4 = unres_schema_add_node(mod,unres,new,UNRES_EXT,snode);
        if (iVar4 == -1) goto LAB_00158cb9;
      }
      else {
        if (plVar5->ext_type == '\0') {
          plVar5 = (lys_ext_instance *)malloc(0x40);
          e[uVar8] = plVar5;
          if (plVar5 == (lys_ext_instance *)0x0) {
LAB_00158c75:
            ly_log((ly_ctx *)orig_local,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
                   "lys_ext_dup");
            goto LAB_00158cb9;
          }
        }
        else if (plVar5->ext_type == '\x01') {
          __size = plVar5->def->plugin[1].check_position;
          plVar5 = (lys_ext_instance *)calloc(1,(size_t)__size);
          e[uVar8] = plVar5;
          if (plVar5 == (lys_ext_instance *)0x0) goto LAB_00158c75;
          plVar5[1].def = *(lys_ext **)(pplVar3[uVar8]->def->plugin + 1);
          memcpy(plVar5 + 1,pplVar3[uVar8] + 1,(size_t)(__size + -0x40));
        }
        else {
          plVar5 = e[uVar8];
        }
        ctx_00 = orig_local;
        plVar5->def = pplVar3[uVar8]->def;
        e[uVar8]->flags = 4;
        pcVar7 = lydict_insert((ly_ctx *)orig_local,local_40[uVar8]->arg_value,0);
        e[uVar8]->arg_value = pcVar7;
        e[uVar8]->parent = parent;
        plVar5 = e[uVar8];
        plVar5->parent_type = (uint8_t)parent_type;
        plVar2 = local_40[uVar8];
        plVar5->insubstmt = plVar2->insubstmt;
        plVar5->insubstmt_index = plVar2->insubstmt_index;
        plVar5->ext_type = plVar2->ext_type;
        plVar5->priv = (void *)0x0;
        plVar5 = e[uVar8];
        plVar5->nodetype = LYS_EXT;
        plVar5->module = mod;
        plVar5 = local_40[uVar8];
        size_00 = plVar5->ext_size;
        plVar2 = e[uVar8];
        plVar2->ext_size = size_00;
        iVar4 = lys_ext_dup((ly_ctx *)ctx_00,mod,plVar5->ext,size_00,plVar2,LYEXT_PAR_EXTINST,
                            &plVar2->ext,shallow,unres);
        if (iVar4 != 0) {
LAB_00158cb9:
          *new = (lys_ext_instance **)0x0;
          lys_extension_instances_free
                    ((ly_ctx *)orig_local,e,(uint)uVar8,(_func_void_lys_node_ptr_void_ptr *)0x0);
          return 1;
        }
        if (shallow != 0) {
          e[uVar8]->priv = local_40[uVar8]->priv;
        }
      }
    }
  }
  return 0;
}

Assistant:

int
lys_ext_dup(struct ly_ctx *ctx, struct lys_module *mod, struct lys_ext_instance **orig, uint8_t size, void *parent,
            LYEXT_PAR parent_type, struct lys_ext_instance ***new, int shallow, struct unres_schema *unres)
{
    int i;
    uint8_t u = 0;
    struct lys_ext_instance **result;
    struct unres_ext *info, *info_orig;
    size_t len;

    assert(new);

    if (!size) {
        if (orig) {
            LOGINT(ctx);
            return EXIT_FAILURE;
        }
        (*new) = NULL;
        return EXIT_SUCCESS;
    }

    (*new) = result = calloc(size, sizeof *result);
    LY_CHECK_ERR_RETURN(!result, LOGMEM(ctx), EXIT_FAILURE);
    for (u = 0; u < size; u++) {
        if (orig[u]) {
            /* resolved extension instance, just duplicate it */
            switch(orig[u]->ext_type) {
            case LYEXT_FLAG:
                result[u] = malloc(sizeof(struct lys_ext_instance));
                LY_CHECK_ERR_GOTO(!result[u], LOGMEM(ctx), error);
                break;
            case LYEXT_COMPLEX:
                len = ((struct lyext_plugin_complex*)orig[u]->def->plugin)->instance_size;
                result[u] = calloc(1, len);
                LY_CHECK_ERR_GOTO(!result[u], LOGMEM(ctx), error);

                ((struct lys_ext_instance_complex*)result[u])->substmt = ((struct lyext_plugin_complex*)orig[u]->def->plugin)->substmt;
                /* TODO duplicate data in extension instance content */
                memcpy((void*)result[u] + sizeof(**orig), (void*)orig[u] + sizeof(**orig), len - sizeof(**orig));
                break;
            }
            /* generic part */
            result[u]->def = orig[u]->def;
            result[u]->flags = LYEXT_OPT_CONTENT;
            result[u]->arg_value = lydict_insert(ctx, orig[u]->arg_value, 0);
            result[u]->parent = parent;
            result[u]->parent_type = parent_type;
            result[u]->insubstmt = orig[u]->insubstmt;
            result[u]->insubstmt_index = orig[u]->insubstmt_index;
            result[u]->ext_type = orig[u]->ext_type;
            result[u]->priv = NULL;
            result[u]->nodetype = LYS_EXT;
            result[u]->module = mod;

            /* extensions */
            result[u]->ext_size = orig[u]->ext_size;
            if (lys_ext_dup(ctx, mod, orig[u]->ext, orig[u]->ext_size, result[u],
                            LYEXT_PAR_EXTINST, &result[u]->ext, shallow, unres)) {
                goto error;
            }

            /* in case of shallow copy (duplication for deviation), duplicate only the link to private data
             * in a new copy, otherwise (grouping instantiation) do not duplicate the private data */
            if (shallow) {
                result[u]->priv = orig[u]->priv;
            }
        } else {
            /* original extension is not yet resolved, so duplicate it in unres */
            i = unres_schema_find(unres, -1, &orig, UNRES_EXT);
            if (i == -1) {
                /* extension not found in unres */
                LOGINT(ctx);
                goto error;
            }
            info_orig = unres->str_snode[i];
            info = malloc(sizeof *info);
            LY_CHECK_ERR_GOTO(!info, LOGMEM(ctx), error);
            info->datatype = info_orig->datatype;
            if (info->datatype == LYS_IN_YIN) {
                info->data.yin = lyxml_dup_elem(ctx, info_orig->data.yin, NULL, 1, 0);
            } /* else TODO YANG */
            info->parent = parent;
            info->mod = mod;
            info->parent_type = parent_type;
            info->ext_index = u;
            if (unres_schema_add_node(info->mod, unres, new, UNRES_EXT, (struct lys_node *)info) == -1) {
                goto error;
            }
        }
    }

    return EXIT_SUCCESS;

error:
    (*new) = NULL;
    lys_extension_instances_free(ctx, result, u, NULL);
    return EXIT_FAILURE;
}